

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::EAMAdapter::makeZhou2004
          (EAMAdapter *this,string *latticeType,RealType re,RealType fe,RealType rhoe,RealType rhos,
          RealType alpha,RealType beta,RealType A,RealType B,RealType kappa,RealType lambda,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType eta,RealType Fe,RealType rhol,RealType rhoh)

{
  AtomType *pAVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  undefined1 local_1e9;
  SimpleTypeData<OpenMD::ZhouParameters> *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  double local_1d8;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  shared_ptr<OpenMD::GenericData> local_198;
  shared_ptr<OpenMD::GenericData> local_188;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  RealType local_148;
  ZhouParameters local_140;
  
  local_1d8 = re;
  local_1d0 = rhos;
  local_1c8 = fe;
  local_1c0 = rhoe;
  local_1b8 = alpha;
  local_1b0 = beta;
  local_1a8 = A;
  local_1a0 = B;
  bVar3 = AtomType::hasProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
  if (bVar3) {
    AtomType::removeProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)ZhouTypeID_abi_cxx11_);
  }
  local_170._0_4_ = eamFuncfl;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_148 = 0.0;
  local_168._M_p = (pointer)&local_158;
  memset(&local_140,0,0x110);
  local_170._0_4_ = eamZhou2004;
  std::locale::locale((locale *)&local_1e8);
  toUpper<std::__cxx11::string>(latticeType,(locale *)&local_1e8);
  std::locale::~locale((locale *)&local_1e8);
  std::__cxx11::string::_M_assign((string *)&local_168);
  iVar4 = std::__cxx11::string::compare((char *)latticeType);
  dVar2 = local_1d8;
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)latticeType);
    if (iVar4 == 0) {
      dVar2 = (local_1d8 + local_1d8) / 1.7320508075688772;
    }
    else {
      dVar2 = (local_1d8 + local_1d8) / 1.4142135623730951;
    }
  }
  local_140.fe = local_1c8;
  local_140.rhoe = local_1c0;
  local_140.alpha = local_1b8;
  local_140.beta = local_1b0;
  local_140.A = local_1a8;
  local_140.B = local_1a0;
  local_140.kappa = kappa;
  local_140.lambda = lambda;
  local_148 = dVar2;
  local_140.re = local_1d8;
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.Fn,Fn);
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.F,F);
  local_140.eta = eta;
  local_140.Fe = Fe;
  local_140.rhos = local_1d0;
  local_140.rhol = rhol;
  local_140.rhoh = rhoh;
  pAVar1 = this->at_;
  local_1e8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&_Stack_1e0,(SimpleTypeData<OpenMD::EAMParameters> **)&local_1e8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)&local_1e9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             EAMtypeID_abi_cxx11_,(EAMParameters *)local_170);
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_GenericData;
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1e0._M_pi;
  local_1e8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar1,&local_188);
  if (local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  pAVar1 = this->at_;
  local_1e8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&_Stack_1e0,&local_1e8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)&local_1e9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ZhouTypeID_abi_cxx11_,&local_140);
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_GenericData;
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1e0._M_pi;
  local_1e8 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar1,&local_198);
  if (local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_140.OF);
  if (local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,
                    CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EAMAdapter::makeZhou2004(std::string latticeType, RealType re,
                                RealType fe, RealType rhoe, RealType rhos,
                                RealType alpha, RealType beta, RealType A,
                                RealType B, RealType kappa, RealType lambda,
                                std::vector<RealType> Fn,
                                std::vector<RealType> F, RealType eta,
                                RealType Fe, RealType rhol, RealType rhoh) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType = eamZhou2004;

    toUpper(latticeType);
    eamParam.latticeType = latticeType;
    // default to FCC if we don't specify HCP or BCC:
    if (latticeType == "HCP")
      eamParam.latticeConstant = re;
    else if (latticeType == "BCC")
      eamParam.latticeConstant = 2.0 * re / sqrt(3.0);
    else
      eamParam.latticeConstant = 2.0 * re / sqrt(2.0);

    zhouParam.re     = re;
    zhouParam.fe     = fe;
    zhouParam.rhoe   = rhoe;
    zhouParam.alpha  = alpha;
    zhouParam.beta   = beta;
    zhouParam.A      = A;
    zhouParam.B      = B;
    zhouParam.kappa  = kappa;
    zhouParam.lambda = lambda;
    zhouParam.Fn     = Fn;
    zhouParam.F      = F;
    zhouParam.eta    = eta;
    zhouParam.Fe     = Fe;
    zhouParam.rhos   = rhos;
    zhouParam.rhol   = rhol;
    zhouParam.rhoh   = rhoh;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }